

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O2

void filter_src_pixels_avx2
               (__m256i src,__m256i *horz_out,__m256i *coeff,__m256i *shuffle_src,
               __m256i *round_const,__m128i *shift,int row)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i alVar4;
  undefined1 auVar5 [32];
  undefined1 in_ZMM0 [64];
  
  auVar5 = in_ZMM0._0_32_;
  auVar1 = vpshufb_avx2(auVar5,(undefined1  [32])*shuffle_src);
  auVar2 = vpshufb_avx2(auVar5,(undefined1  [32])shuffle_src[1]);
  auVar3 = vpshufb_avx2(auVar5,(undefined1  [32])shuffle_src[2]);
  auVar5 = vpshufb_avx2(auVar5,(undefined1  [32])shuffle_src[3]);
  auVar1 = vpmaddubsw_avx2(auVar1,(undefined1  [32])*coeff);
  auVar2 = vpmaddubsw_avx2(auVar2,(undefined1  [32])coeff[1]);
  auVar1 = vpaddw_avx2(auVar2,auVar1);
  auVar2 = vpmaddubsw_avx2(auVar3,(undefined1  [32])coeff[2]);
  auVar3 = vpmaddubsw_avx2(auVar5,(undefined1  [32])coeff[3]);
  auVar2 = vpaddw_avx2(auVar2,auVar3);
  auVar1 = vpaddw_avx2(auVar1,auVar2);
  auVar1 = vpaddw_avx2(auVar1,(undefined1  [32])*round_const);
  alVar4 = (__m256i)vpsrlw_avx2(auVar1,(undefined1  [16])*shift);
  horz_out[row] = alVar4;
  return;
}

Assistant:

static inline void filter_src_pixels_avx2(const __m256i src, __m256i *horz_out,
                                          __m256i *coeff,
                                          const __m256i *shuffle_src,
                                          const __m256i *round_const,
                                          const __m128i *shift, int row) {
  const __m256i src_0 = _mm256_shuffle_epi8(src, shuffle_src[0]);
  const __m256i src_1 = _mm256_shuffle_epi8(src, shuffle_src[1]);
  const __m256i src_2 = _mm256_shuffle_epi8(src, shuffle_src[2]);
  const __m256i src_3 = _mm256_shuffle_epi8(src, shuffle_src[3]);

  const __m256i res_02 = _mm256_maddubs_epi16(src_0, coeff[0]);
  const __m256i res_46 = _mm256_maddubs_epi16(src_1, coeff[1]);
  const __m256i res_13 = _mm256_maddubs_epi16(src_2, coeff[2]);
  const __m256i res_57 = _mm256_maddubs_epi16(src_3, coeff[3]);

  const __m256i res_even = _mm256_add_epi16(res_02, res_46);
  const __m256i res_odd = _mm256_add_epi16(res_13, res_57);
  const __m256i res =
      _mm256_add_epi16(_mm256_add_epi16(res_even, res_odd), *round_const);
  horz_out[row] = _mm256_srl_epi16(res, *shift);
}